

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O3

bool __thiscall DOptionMenu::Responder(DOptionMenu *this,event_t *ev)

{
  BYTE BVar1;
  short sVar2;
  FOptionMenuDescriptor *pFVar3;
  bool bVar4;
  int iVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  int iVar8;
  undefined8 uVar9;
  
  if (ev->type == '\x04') {
    if (ev->subtype == '\x11') {
      if (this->CanScrollDown == true) {
        iVar5 = this->VisBottom;
        pFVar3 = this->mDesc;
        if (iVar5 < (int)((pFVar3->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count
                         - 2)) {
          pFVar3->mScrollPos = pFVar3->mScrollPos + 2;
          iVar5 = iVar5 + 2;
        }
        else {
          pFVar3->mScrollPos = pFVar3->mScrollPos + 1;
          iVar5 = iVar5 + 1;
        }
        this->VisBottom = iVar5;
      }
      return true;
    }
    if (ev->subtype == '\x10') {
      iVar5 = this->mDesc->mScrollPos;
      iVar8 = 2;
      if (iVar5 < 2) {
        iVar8 = iVar5;
      }
      this->mDesc->mScrollPos = iVar5 - iVar8;
      return true;
    }
  }
  if (ev->type != '\x04') {
    return false;
  }
  BVar1 = ev->subtype;
  if (BVar1 == '\x06') {
    BackbuttonTime = 0x8c;
    if (((this->super_DMenu).super_DObject.field_0x24 == '\0') && (m_use_mouse.Value != 1)) {
      BackbuttonTime = 0x8c;
      return false;
    }
    bVar4 = DMenu::MouseEventBack(&this->super_DMenu,1,(int)ev->data1,(int)ev->data2);
    if (bVar4) {
      ev->data2 = -1;
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = (ulong)(uint)(int)ev->data2;
    }
    sVar2 = ev->data1;
    pp_Var6 = (this->super_DMenu).super_DObject._vptr_DObject;
    uVar9 = 1;
  }
  else {
    if (BVar1 != '\b') {
      if (BVar1 != '\a') {
        return false;
      }
      bVar4 = DMenu::MouseEventBack(&this->super_DMenu,0,(int)ev->data1,(int)ev->data2);
      if (bVar4) {
        ev->data2 = -1;
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = (ulong)(uint)(int)ev->data2;
      }
      iVar5 = (*(this->super_DMenu).super_DObject._vptr_DObject[0xe])
                        (this,0,(ulong)(uint)(int)ev->data1,uVar7);
      if ((byte)(bVar4 | (byte)iVar5) != 1) {
        return false;
      }
      if ((this->super_DMenu).super_DObject.field_0x24 != '\0') {
        return false;
      }
      (this->super_DMenu).super_DObject.field_0x24 = 1;
      I_SetMouseCapture();
      return false;
    }
    if ((this->super_DMenu).super_DObject.field_0x24 != '\x01') {
      return false;
    }
    (this->super_DMenu).super_DObject.field_0x24 = 0;
    I_ReleaseMouseCapture();
    bVar4 = DMenu::MouseEventBack(&this->super_DMenu,2,(int)ev->data1,(int)ev->data2);
    if (bVar4) {
      ev->data2 = -1;
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = (ulong)(uint)(int)ev->data2;
    }
    sVar2 = ev->data1;
    pp_Var6 = (this->super_DMenu).super_DObject._vptr_DObject;
    uVar9 = 2;
  }
  (*pp_Var6[0xe])(this,uVar9,(ulong)(uint)(int)sVar2,uVar7);
  return false;
}

Assistant:

bool DOptionMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_WheelUp)
		{
			int scrollamt = MIN(2, mDesc->mScrollPos);
			mDesc->mScrollPos -= scrollamt;
			return true;
		}
		else if (ev->subtype == EV_GUI_WheelDown)
		{
			if (CanScrollDown)
			{
				if (VisBottom < (int)(mDesc->mItems.Size()-2))
				{
					mDesc->mScrollPos += 2;
					VisBottom += 2;
				}
				else
				{
					mDesc->mScrollPos++;
					VisBottom++;
				}
			}
			return true;
		}
	}
	return Super::Responder(ev);
}